

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpm.c
# Opt level: O3

double * inform_tpm(int *series,size_t n,size_t m,int b,double *tpm,inform_error *err)

{
  inform_error iVar1;
  ulong uVar2;
  long lVar3;
  size_t sVar4;
  uint uVar5;
  ulong uVar6;
  size_t sVar7;
  double *pdVar8;
  ulong uVar9;
  double sum;
  double dVar10;
  
  if (series == (int *)0x0) {
    iVar1 = INFORM_ETIMESERIES;
  }
  else if (n == 0) {
    iVar1 = INFORM_ENOINITS;
  }
  else if (m < 2) {
    iVar1 = INFORM_ESHORTSERIES;
  }
  else {
    if (1 < b) {
      if (m * n != 0) {
        lVar3 = 0;
        do {
          if (series[lVar3] < 0) {
            iVar1 = INFORM_ENEGSTATE;
            goto LAB_0015e5c1;
          }
          if ((uint)b <= (uint)series[lVar3]) {
            iVar1 = INFORM_EBADSTATE;
            goto LAB_0015e5c1;
          }
          lVar3 = lVar3 + 1;
        } while (m * n - lVar3 != 0);
      }
      uVar5 = b * b;
      if (tpm == (double *)0x0) {
        tpm = (double *)calloc((ulong)uVar5,8);
        if (tpm == (double *)0x0) {
          iVar1 = INFORM_ENOMEM;
          goto LAB_0015e5c1;
        }
      }
      else {
        memset(tpm,0,(ulong)(uVar5 + (uVar5 == 0)) << 3);
      }
      sVar4 = 0;
      do {
        sVar7 = 1;
        do {
          lVar3 = (long)series[sVar7] + (long)series[sVar7 - 1] * (long)b;
          tpm[lVar3] = tpm[lVar3] + 1.0;
          sVar7 = sVar7 + 1;
        } while (m != sVar7);
        sVar4 = sVar4 + 1;
        series = series + m;
      } while (sVar4 != n);
      uVar2 = (ulong)(uint)b;
      uVar6 = 0;
      pdVar8 = tpm;
      do {
        uVar9 = 0;
        dVar10 = 0.0;
        do {
          dVar10 = dVar10 + pdVar8[uVar9];
          uVar9 = uVar9 + 1;
        } while (uVar2 != uVar9);
        if ((dVar10 != 0.0) || (NAN(dVar10))) {
          uVar9 = 0;
          do {
            pdVar8[uVar9] = pdVar8[uVar9] / dVar10;
            uVar9 = uVar9 + 1;
          } while (uVar2 != uVar9);
        }
        else if (err != (inform_error *)0x0) {
          *err = INFORM_ETPMROW;
        }
        uVar6 = uVar6 + 1;
        pdVar8 = pdVar8 + uVar2;
      } while (uVar6 != uVar2);
      return tpm;
    }
    iVar1 = INFORM_EBIN;
  }
LAB_0015e5c1:
  if (err != (inform_error *)0x0) {
    *err = iVar1;
  }
  return (double *)0x0;
}

Assistant:

double *inform_tpm(int const *series, size_t n, size_t m, int b, double *tpm,
    inform_error *err)
{
    if (check_arguments(series, n, m, b, err))
        return NULL;

    if ((tpm = setup_tpm(tpm, b, err)) == NULL)
        return NULL;

    int current = 0, future = 0;
    for (size_t i = 0; i < n; ++i)
    {
        for (size_t j = 0; j < m - 1; ++j)
        {
            current = series[m * i + j];
            future = series[m * i + j + 1];
            tpm[b * current + future] += 1;
        }
    }

    for (int i = 0; i < b; ++i)
    {
        double sum = 0.0;
        for (int j = 0; j < b; ++j)
            sum += tpm[b * i + j];

        if (sum != 0.0)
        {
            for (int j = 0; j < b; ++j)
            {
                tpm[b * i + j] /= sum;
            }
        }
        else
        {
            INFORM_ERROR(err, INFORM_ETPMROW);
        }
    }

    return tpm;
}